

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBuildPrograms.cpp
# Opt level: O3

void __thiscall vkt::anon_unknown_0::TaskExecutorThread::run(TaskExecutorThread *this)

{
  TaskQueue *pTVar1;
  pointer ppTVar2;
  size_t sVar3;
  Task *pTVar4;
  
  while( true ) {
    pTVar1 = this->m_tasks;
    deMutex_lock((pTVar1->m_readMutex).m_mutex);
    deSemaphore_decrement((pTVar1->m_fill).m_semaphore);
    ppTVar2 = (pTVar1->m_elements).
              super__Vector_base<vkt::(anonymous_namespace)::Task_*,_std::allocator<vkt::(anonymous_namespace)::Task_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    sVar3 = pTVar1->m_back;
    pTVar1->m_back = (sVar3 + 1) % pTVar1->m_size;
    pTVar4 = ppTVar2[sVar3];
    deSemaphore_increment((pTVar1->m_empty).m_semaphore);
    deMutex_unlock((pTVar1->m_readMutex).m_mutex);
    if (pTVar4 == (Task *)0x0) break;
    (**pTVar4->_vptr_Task)(pTVar4);
  }
  return;
}

Assistant:

void run (void)
	{
		for (;;)
		{
			Task* const	task	= m_tasks.popBack();

			if (task)
				task->execute();
			else
				break; // End of tasks - time to terminate
		}
	}